

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::renderTestPattern
          (LineRenderCase *this,IterationConfig *config)

{
  ostringstream *poVar1;
  code *pcVar2;
  undefined8 uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  float fVar8;
  undefined1 local_1a0 [384];
  long lVar7;
  
  iVar4 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  BBoxRenderCase::setupRender(&this->super_BBoxRenderCase,config);
  if ((this->super_BBoxRenderCase).m_hasTessellationStage == true) {
    iVar4 = (**(code **)(lVar7 + 0xb48))
                      ((((this->super_BBoxRenderCase).m_program.
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                         .m_data.ptr)->m_program).m_program);
    if (iVar4 == -1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"tessLevelPos != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                 ,0x70e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_1a0._0_8_ =
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"u_tessellationLevel = ");
    std::ostream::operator<<(poVar1,2.8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x14e0))(0x40333333,iVar4);
    (**(code **)(lVar7 + 0xfd8))(0x8e72,2);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x714);
  }
  if (this->m_isWideLineCase == true) {
    (**(code **)(lVar7 + 0xce0))((float)this->m_wideLineLineWidth);
  }
  pcVar2 = *(code **)(lVar7 + 0x14e0);
  uVar6 = (**(code **)(lVar7 + 0xb48))
                    ((((this->super_BBoxRenderCase).m_program.
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"u_lineWidth");
  if (this->m_isWideLineCase == false) {
    fVar8 = 1.0;
  }
  else {
    fVar8 = (float)this->m_wideLineLineWidth;
  }
  (*pcVar2)(fVar8,uVar6);
  local_1a0._0_8_ =
       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering pattern.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar7 + 0x5e0))(0xbe2);
  (**(code **)(lVar7 + 0x120))(1,1);
  (**(code **)(lVar7 + 0x100))(0x8006);
  uVar3 = 0xe;
  if ((this->super_BBoxRenderCase).m_hasTessellationStage == false) {
    uVar3 = 1;
  }
  iVar4 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  (**(code **)(lVar7 + 0x538))(uVar3,0,iVar4 * iVar4 * 4);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x723);
  return;
}

Assistant:

void LineRenderCase::renderTestPattern (const IterationConfig& config)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	setupRender(config);

	if (m_hasTessellationStage)
	{
		const glw::GLint	tessLevelPos	= gl.getUniformLocation(m_program->getProgram(), "u_tessellationLevel");
		const glw::GLfloat	tessLevel		= 2.8f; // will be rounded up

		TCU_CHECK(tessLevelPos != -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "u_tessellationLevel = " << tessLevel << tcu::TestLog::EndMessage;

		gl.uniform1f(tessLevelPos, tessLevel);
		gl.patchParameteri(GL_PATCH_VERTICES, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "patch param");
	}

	if (m_isWideLineCase)
		gl.lineWidth((float)m_wideLineLineWidth);

	gl.uniform1f(gl.getUniformLocation(m_program->getProgram(), "u_lineWidth"), (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f));

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering pattern." << tcu::TestLog::EndMessage;

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_ONE, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);

	gl.drawArrays((m_hasTessellationStage) ? (GL_PATCHES) : (GL_LINES), 0, m_patternSide * m_patternSide * 2 * 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");
}